

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::EndResultVerifier::operator()
          (EndResultVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ChannelType CVar1;
  int iVar2;
  int iVar3;
  AtomicOperation AVar4;
  undefined4 uVar5;
  bool bVar6;
  long *plVar7;
  char *__s;
  undefined8 *puVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ConstPixelBufferAccess *pCVar11;
  void *__buf;
  int (*arr) [5];
  Vector<int,_3> (*arr_00) [5];
  int (*arr_01) [5];
  size_type *psVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  int atomicArgs [5];
  IVec3 invocationGlobalIDs [5];
  ostringstream s;
  int local_730;
  allocator<char> local_729;
  string local_728;
  int local_704;
  int local_700;
  float local_6fc;
  ConstPixelBufferAccess *local_6f8;
  TestLog *local_6f0;
  EndResultVerifier *local_6e8;
  int local_6dc;
  long *local_6d8 [2];
  long local_6c8 [2];
  Functional local_6b8 [32];
  string local_698;
  undefined8 uStack_678;
  undefined4 uStack_670;
  undefined4 local_66c;
  undefined4 uStack_668;
  undefined8 uStack_664;
  string local_658;
  Vector<int,_2> local_638;
  undefined1 local_630 [8];
  _func_int **local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620 [6];
  ios_base local_5c0 [8];
  ios_base local_5b8 [264];
  undefined1 local_4b0 [8];
  undefined1 local_4a8 [112];
  ios_base local_438 [264];
  undefined1 local_330 [8];
  undefined1 local_328 [24];
  _Alloc_hider local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300 [4];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  CVar1 = (resultSlice->m_format).type;
  if ((0x21 < (ulong)CVar1) || (bVar20 = true, (0x2c0000000U >> ((ulong)CVar1 & 0x3f) & 1) == 0)) {
    bVar20 = CVar1 - SIGNED_INT8 < 3;
  }
  iVar18 = (resultSlice->m_size).m_data[0];
  iVar2 = (resultSlice->m_size).m_data[1];
  local_6f0 = log;
  local_6e8 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::ostream::operator<<((ostringstream *)local_4b0,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x1c92b18);
  local_630 = (undefined1  [8])local_620;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar10) {
    local_620[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_620[0]._8_8_ = plVar7[3];
  }
  else {
    local_620[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_630 = (undefined1  [8])*plVar7;
  }
  local_628 = (_func_int **)plVar7[1];
  *plVar7 = (long)paVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_6f8 = resultSlice;
  if (local_6e8->m_imageType == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_01c91b3c)
                     [(int)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces
                           )[sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_6d8,__s,&local_729);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_6d8,0,(char *)0x0,0x1cfa86a);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::ostream::operator<<(local_4b0,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_6d8,0,(char *)0x0,0x1c92647);
  }
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  psVar12 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_728.field_2._M_allocated_capacity = *psVar12;
    local_728.field_2._8_8_ = puVar8[3];
  }
  else {
    local_728.field_2._M_allocated_capacity = *psVar12;
    local_728._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_728._M_string_length = puVar8[1];
  *puVar8 = psVar12;
  puVar8[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_728,0,(char *)0x0,0x1c92b23);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_698.field_2._M_allocated_capacity = *psVar12;
    local_698.field_2._8_8_ = plVar7[3];
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  }
  else {
    local_698.field_2._M_allocated_capacity = *psVar12;
    local_698._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_698._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pCVar11 = local_6f8;
  tcu::LogImage::LogImage
            ((LogImage *)local_330,(string *)local_630,&local_698,local_6f8,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_330,(int)local_6f0,__buf,(size_t)pCVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_p != local_300) {
    operator_delete(local_310._M_p,local_300[0]._M_allocated_capacity + 1);
  }
  if (local_330 != (undefined1  [8])(local_328 + 8)) {
    operator_delete((void *)local_330,local_328._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  pCVar11 = local_6f8;
  if (local_6d8[0] != local_6c8) {
    operator_delete(local_6d8[0],local_6c8[0] + 1);
  }
  if (local_630 != (undefined1  [8])local_620) {
    operator_delete((void *)local_630,local_620[0]._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
  iVar17 = (pCVar11->m_size).m_data[1];
  bVar6 = iVar17 < 1;
  if (0 < iVar17) {
    local_6dc = sliceOrFaceNdx * sliceOrFaceNdx;
    local_704 = iVar18 * iVar2 * sliceOrFaceNdx * 5;
    iVar18 = 0;
    do {
      if (0 < (pCVar11->m_size).m_data[0]) {
        iVar19 = iVar18 * iVar18 + local_6dc;
        iVar17 = 0;
        local_730 = local_704;
        do {
          if (bVar20) {
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_4b0,(int)pCVar11,iVar17,iVar18);
          }
          else {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_4b0,(int)pCVar11,iVar17,iVar18);
          }
          uVar5 = local_4b0._0_4_;
          uStack_668 = 0;
          uStack_664 = 0;
          uStack_678 = 0;
          uStack_670 = 0;
          local_66c = 0;
          local_698.field_2._M_allocated_capacity = 0;
          local_698.field_2._8_8_ = 0;
          local_698._M_dataplus._M_p = (pointer)0x0;
          local_698._M_string_length = 0;
          iVar3 = (pCVar11->m_size).m_data[0];
          AVar4 = local_6e8->m_operation;
          psVar12 = &local_698._M_string_length;
          lVar15 = 0;
          iVar13 = local_730;
          iVar14 = iVar17;
          do {
            *(int *)&(((string *)(psVar12 + -1))->_M_dataplus)._M_p = iVar14;
            *(int *)((long)psVar12 + -4) = iVar18;
            *(int *)psVar12 = sliceOrFaceNdx;
            if (AVar4 < ATOMIC_OPERATION_EXCHANGE) {
              iVar16 = iVar14 * iVar14 + iVar19;
            }
            else {
              iVar16 = -1;
              if (AVar4 == ATOMIC_OPERATION_EXCHANGE) {
                iVar16 = iVar13;
              }
            }
            *(int *)(local_6b8 + lVar15 * 4) = iVar16;
            lVar15 = lVar15 + 1;
            iVar14 = iVar14 + iVar3;
            iVar13 = iVar13 + iVar2 * iVar3;
            psVar12 = (size_type *)((long)psVar12 + 0xc);
          } while (lVar15 != 5);
          AVar4 = local_6e8->m_operation;
          uVar9 = (ulong)AVar4;
          if (uVar9 < 6) {
            fVar22 = *(float *)(&DAT_01c91b54 + uVar9 * 4);
            lVar15 = 0;
            do {
              if (AVar4 < ATOMIC_OPERATION_COMP_SWAP) {
                fVar23 = *(float *)(local_6b8 + lVar15 * 4);
                switch(uVar9) {
                case 0:
                  fVar22 = (float)((int)fVar22 + (int)fVar23);
                  break;
                case 1:
                  if ((int)fVar23 <= (int)fVar22) {
                    fVar22 = fVar23;
                  }
                  break;
                case 2:
                  if ((int)fVar22 <= (int)fVar23) {
                    fVar22 = fVar23;
                  }
                  break;
                case 3:
                  fVar22 = (float)((uint)fVar22 & (uint)fVar23);
                  break;
                case 4:
                  fVar22 = (float)((uint)fVar22 | (uint)fVar23);
                  break;
                case 5:
                  fVar22 = (float)((uint)fVar22 ^ (uint)fVar23);
                  break;
                case 6:
                  fVar22 = fVar23;
                }
              }
              else {
                fVar22 = -NAN;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != 5);
            if ((float)uVar5 != fVar22) {
              local_1b0 = (undefined1  [8])local_6f0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"// Failure: end result at pixel ",0x20);
              local_638.m_data[0] = iVar17;
              local_638.m_data[1] = iVar18;
              tcu::operator<<((ostream *)&local_1a8,&local_638);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8," of current layer is ",0x15);
              std::ostream::operator<<((ostringstream *)&local_1a8,uVar5);
              local_630 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_1b0,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_628,"// Note: relevant shader invocation global IDs are "
                         ,0x33);
              arrayStr<tcu::Vector<int,3>,5>(&local_728,(Functional *)&local_698,arr_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_628,local_728._M_dataplus._M_p,local_728._M_string_length
                        );
              local_330 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_630,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,"// Note: data expression values for the IDs are ",
                         0x30);
              arrayStr<int,5>(&local_658,local_6b8,arr_01);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,local_658._M_dataplus._M_p,local_658._M_string_length)
              ;
              local_4b0 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_330,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,"// Note: reference value is ",0x1c);
              std::ostream::operator<<((ostringstream *)local_4a8,(int)fVar22);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
              std::ios_base::~ios_base(local_438);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_658._M_dataplus._M_p != &local_658.field_2) {
                operator_delete(local_658._M_dataplus._M_p,
                                local_658.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
              std::ios_base::~ios_base(local_2b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_728._M_dataplus._M_p != &local_728.field_2) {
                operator_delete(local_728._M_dataplus._M_p,
                                local_728.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
              std::ios_base::~ios_base(local_5b8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
              return bVar6;
            }
          }
          else if (AVar4 == ATOMIC_OPERATION_EXCHANGE) {
            local_6fc = (float)uVar5;
            uVar9 = 0;
            do {
              if (bVar20) {
                bVar21 = (float)uVar5 == *(float *)(local_6b8 + uVar9 * 4);
              }
              else {
                fVar23 = (float)uVar5 - (float)(int)*(float *)(local_6b8 + uVar9 * 4);
                fVar22 = -fVar23;
                if (-fVar23 <= fVar23) {
                  fVar22 = fVar23;
                }
                bVar21 = fVar22 <= 0.01;
              }
            } while ((uVar9 < 4) && (uVar9 = uVar9 + 1, !bVar21));
            if (!bVar21) {
              local_330 = (undefined1  [8])local_6f0;
              local_700 = iVar17;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,"// Failure: invalid value at pixel ",0x23);
              local_728._M_dataplus._M_p._4_4_ = iVar18;
              local_728._M_dataplus._M_p._0_4_ = local_700;
              tcu::operator<<((ostream *)local_328,(Vector<int,_2> *)&local_728);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,": got ",6);
              if (bVar20) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
                std::ostream::operator<<(local_630,uVar5);
                std::__cxx11::stringbuf::str();
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
                std::ostream::_M_insert<double>((double)local_6fc);
                std::__cxx11::stringbuf::str();
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
              std::ios_base::~ios_base(local_5c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,(char *)local_1b0,(long)local_1a8);
              local_4b0 = (undefined1  [8])
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_330,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,"// Note: expected one of ",0x19);
              arrayStr<int,5>((string *)local_630,local_6b8,arr);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,(char *)local_630,(long)local_628);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if (local_630 != (undefined1  [8])local_620) {
                operator_delete((void *)local_630,local_620[0]._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
              std::ios_base::~ios_base(local_438);
              if (local_1b0 != (undefined1  [8])local_1a0) {
                operator_delete((void *)local_1b0,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
              std::ios_base::~ios_base(local_2b8);
              return bVar6;
            }
          }
          iVar17 = iVar17 + 1;
          local_730 = local_730 + iVar2;
          pCVar11 = local_6f8;
        } while (iVar17 < (local_6f8->m_size).m_data[0]);
      }
      iVar18 = iVar18 + 1;
      local_704 = local_704 + 1;
      iVar17 = (pCVar11->m_size).m_data[1];
      bVar6 = iVar17 <= iVar18;
    } while (iVar18 < iVar17);
  }
  return bVar6;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool		isIntegerFormat		= isFormatTypeInteger(resultSlice.getFormat().type);
		const IVec2		dispatchSizeXY		(NUM_INVOCATIONS_PER_PIXEL*resultSlice.getWidth(), resultSlice.getHeight());

		log << TestLog::Image("EndResults" + toString(sliceOrFaceNdx),
							  "Result Values, " + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																				   : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < resultSlice.getWidth(); x++)
		{
			union
			{
				int		i;
				float	f;
			} result;

			if (isIntegerFormat)
				result.i = resultSlice.getPixelInt(x, y).x();
			else
				result.f = resultSlice.getPixel(x, y).x();

			// Compute the arguments that were given to the atomic function in the invocations that contribute to this pixel.

			IVec3	invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			int		atomicArgs[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec3 gid(x + i*resultSlice.getWidth(), y, sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				atomicArgs[i]			= getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
			}

			if (isOrderIndependentAtomicOperation(m_operation))
			{
				// Just accumulate the atomic args (and the initial value) according to the operation, and compare.

				DE_ASSERT(isIntegerFormat);

				int reference = getOperationInitialValue(m_operation);

				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
					reference = computeBinaryAtomicOperationResult(m_operation, reference, atomicArgs[i]);

				if (result.i != reference)
				{
					log << TestLog::Message << "// Failure: end result at pixel " << IVec2(x, y) << " of current layer is " << result.i << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: data expression values for the IDs are " << arrayStr(atomicArgs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: reference value is " << reference << TestLog::EndMessage;
					return false;
				}
			}
			else if (m_operation == ATOMIC_OPERATION_EXCHANGE)
			{
				// Check that the end result equals one of the atomic args.

				bool matchFound = false;

				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL && !matchFound; i++)
					matchFound = isIntegerFormat ? result.i == atomicArgs[i]
												 : de::abs(result.f - (float)atomicArgs[i]) <= 0.01f;

				if (!matchFound)
				{
					log << TestLog::Message << "// Failure: invalid value at pixel " << IVec2(x, y) << ": got " << (isIntegerFormat ? toString(result.i) : toString(result.f)) << TestLog::EndMessage
											<< TestLog::Message << "// Note: expected one of " << arrayStr(atomicArgs) << TestLog::EndMessage;

					return false;
				}
			}
			else
				DE_ASSERT(false);
		}

		return true;
	}